

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.h
# Opt level: O0

int depspawn::internal::
    fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void_(float_*,_const_float_(*)[6000],_const_float_*),_boost::add_reference<mpl_::arg<_1>_>_>,_0L>,_float_*,_const_float_(*)[6000],_float_(&)[6000]>
              (arg_info **args,float **h,float (**t) [6000],float (*t_1) [6000])

{
  int iVar1;
  float (*in_RCX) [6000];
  float (**in_RDX) [6000];
  arg_info **in_RSI;
  int process_argument;
  bool is_barray;
  bool is_writable;
  bool is_const;
  bool is_reference;
  
  iVar1 = fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void_(float_*,_const_float_(*)[6000],_const_float_*),_boost::add_reference<mpl_::arg<_1>_>_>,_1L>,_const_float_(*)[6000],_float_(&)[6000]>
                    (in_RSI,in_RDX,in_RCX);
  return iVar1;
}

Assistant:

int fill_args(arg_info*& args, Head&& h, Tail&&... t) {
      typedef typename boost::mpl::deref<T_it>::type curr_t;    //Formal parameter type
      constexpr bool is_reference = std::is_reference<curr_t>::value;
      typedef typename std::remove_reference<curr_t>::type deref_t;
      constexpr bool is_const = std::is_const<deref_t>::value;
      constexpr bool is_writable = is_reference && !is_const;
      constexpr bool is_barray = is_blitz_array<typename std::remove_const<typename std::remove_reference<Head>::type>::type>::value;
      constexpr int process_argument =
      !is_ignored<curr_t&&>::value &&
      !is_ignored<Head&&>::value &&
      !(std::is_rvalue_reference<Head&&>::value && !is_barray);
      
      if(process_argument) {
	
        arg_info* n = arg_info::Pool.malloc();
	n->size = sizeof(Head);
	n->wr = is_writable;
	n->next = nullptr;
	n->fill_in_array(h);
	
	// Insert new_arg (n) in order
	n->insert_in_arglist(args);
      }
      
      return process_argument + fill_args<typename boost::mpl::next<T_it>::type>(args, std::forward<Tail>(t)...);
    }